

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_DEF(Context *ctx)

{
  char local_e8 [8];
  char val3 [32];
  char val2 [32];
  char val1 [32];
  char val0 [32];
  float *val;
  char dst [64];
  Context *ctx_local;
  
  make_D3D_destarg_string(ctx,(char *)&val,0x40);
  floatstr(ctx,val1 + 0x18,0x20,(float)ctx->dwords[0],0);
  floatstr(ctx,val2 + 0x18,0x20,(float)ctx->dwords[1],0);
  floatstr(ctx,val3 + 0x18,0x20,(float)ctx->dwords[2],0);
  floatstr(ctx,local_e8,0x20,(float)ctx->dwords[3],0);
  output_line(ctx,"def%s, %s, %s, %s, %s",&val,val1 + 0x18,val2 + 0x18,val3 + 0x18,local_e8);
  return;
}

Assistant:

static void emit_D3D_DEF(Context *ctx)
{
    char dst[64];
    make_D3D_destarg_string(ctx, dst, sizeof (dst));
    const float *val = (const float *) ctx->dwords; // !!! FIXME: could be int?
    char val0[32];
    char val1[32];
    char val2[32];
    char val3[32];
    floatstr(ctx, val0, sizeof (val0), val[0], 0);
    floatstr(ctx, val1, sizeof (val1), val[1], 0);
    floatstr(ctx, val2, sizeof (val2), val[2], 0);
    floatstr(ctx, val3, sizeof (val3), val[3], 0);
    output_line(ctx, "def%s, %s, %s, %s, %s", dst, val0, val1, val2, val3);
}